

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_output.cc
# Opt level: O3

int main(void)

{
  parameter_type P;
  parameter_type P_00;
  parameter_type P_01;
  parameter_type P_02;
  parameter_type P_03;
  parameter_type P_04;
  parameter_type P_05;
  parameter_type P_06;
  minstd R;
  lcg64 r;
  minstd mStack_402a4;
  string sStack_402a0;
  string sStack_40280;
  string sStack_40260;
  string sStack_40240;
  string sStack_40220;
  string sStack_40200;
  string sStack_401e0;
  string sStack_401c0;
  string sStack_401a0;
  string sStack_40180;
  string sStack_40160;
  string sStack_40140;
  string sStack_40120;
  string sStack_40100;
  string sStack_400e0;
  string sStack_400c0;
  string sStack_400a0;
  string sStack_40080;
  string sStack_40060;
  string sStack_40040;
  lagfib2xor<unsigned_long,_9842U,_19937U> lStack_40020;
  
  P.b = 1;
  P.a = 0xfbd19fbbc5c07ff5;
  trng::lcg64::lcg64((lcg64 *)&lStack_40020,P);
  sStack_40040._M_dataplus._M_p = (pointer)&sStack_40040.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_40040,"trng::lcg64","");
  sample_output<trng::lcg64>((lcg64 *)&lStack_40020,&sStack_40040);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_40040._M_dataplus._M_p != &sStack_40040.field_2) {
    operator_delete(sStack_40040._M_dataplus._M_p);
  }
  P_00.b = 1;
  P_00.a = 0xfbd19fbbc5c07ff5;
  trng::lcg64_shift::lcg64_shift((lcg64_shift *)&lStack_40020,P_00);
  sStack_40060._M_dataplus._M_p = (pointer)&sStack_40060.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_40060,"trng::lcg64_shift","");
  sample_output<trng::lcg64_shift>((lcg64_shift *)&lStack_40020,&sStack_40060);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_40060._M_dataplus._M_p != &sStack_40060.field_2) {
    operator_delete(sStack_40060._M_dataplus._M_p);
  }
  trng::mrg2::mrg2((mrg2 *)&lStack_40020,(parameter_type)0x45335114595605e5);
  sStack_40080._M_dataplus._M_p = (pointer)&sStack_40080.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_40080,"trng::mrg2","");
  sample_output<trng::mrg2>((mrg2 *)&lStack_40020,&sStack_40080);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_40080._M_dataplus._M_p != &sStack_40080.field_2) {
    operator_delete(sStack_40080._M_dataplus._M_p);
  }
  P_03.a[2] = 0x75e21f71;
  P_03.a[0] = 0x787c73e9;
  P_03.a[1] = 0x6ce5b0df;
  trng::mrg3::mrg3((mrg3 *)&lStack_40020,P_03);
  sStack_400a0._M_dataplus._M_p = (pointer)&sStack_400a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_400a0,"trng::mrg3","");
  sample_output<trng::mrg3>((mrg3 *)&lStack_40020,&sStack_400a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_400a0._M_dataplus._M_p != &sStack_400a0.field_2) {
    operator_delete(sStack_400a0._M_dataplus._M_p);
  }
  P_04.a[2] = 0x79883501;
  P_04.a[0] = 0x78b65021;
  P_04.a[1] = 0x4256534d;
  trng::mrg3s::mrg3s((mrg3s *)&lStack_40020,P_04);
  sStack_400c0._M_dataplus._M_p = (pointer)&sStack_400c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_400c0,"trng::mrg3s","");
  sample_output<trng::mrg3s>((mrg3s *)&lStack_40020,&sStack_400c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_400c0._M_dataplus._M_p != &sStack_400c0.field_2) {
    operator_delete(sStack_400c0._M_dataplus._M_p);
  }
  P_01.a[2] = 0x44ddb3f9;
  P_01.a[3] = 0x6370d8d2;
  P_01.a[0] = 0x7753d502;
  P_01.a[1] = 0x542dbf61;
  trng::mrg4::mrg4((mrg4 *)&lStack_40020,P_01);
  sStack_400e0._M_dataplus._M_p = (pointer)&sStack_400e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_400e0,"trng::mrg4","");
  sample_output<trng::mrg4>((mrg4 *)&lStack_40020,&sStack_400e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_400e0._M_dataplus._M_p != &sStack_400e0.field_2) {
    operator_delete(sStack_400e0._M_dataplus._M_p);
  }
  trng::mrg5::mrg5((mrg5 *)&lStack_40020,(parameter_type *)trng::mrg5::LEcuyer1);
  sStack_40100._M_dataplus._M_p = (pointer)&sStack_40100.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_40100,"trng::mrg5","");
  sample_output<trng::mrg5>((mrg5 *)&lStack_40020,&sStack_40100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_40100._M_dataplus._M_p != &sStack_40100.field_2) {
    operator_delete(sStack_40100._M_dataplus._M_p);
  }
  trng::mrg5s::mrg5s((mrg5s *)&lStack_40020,(parameter_type *)trng::mrg5s::trng0);
  sStack_40120._M_dataplus._M_p = (pointer)&sStack_40120.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_40120,"trng::mrg5s","");
  sample_output<trng::mrg5s>((mrg5s *)&lStack_40020,&sStack_40120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_40120._M_dataplus._M_p != &sStack_40120.field_2) {
    operator_delete(sStack_40120._M_dataplus._M_p);
  }
  trng::yarn2::yarn2((yarn2 *)&lStack_40020,trng::yarn2::LEcuyer1);
  sStack_40140._M_dataplus._M_p = (pointer)&sStack_40140.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_40140,"trng::yarn2","");
  sample_output<trng::yarn2>((yarn2 *)&lStack_40020,&sStack_40140);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_40140._M_dataplus._M_p != &sStack_40140.field_2) {
    operator_delete(sStack_40140._M_dataplus._M_p);
  }
  P_05.a[2] = DAT_0016c0e0;
  P_05.a[0] = (undefined4)trng::yarn3::LEcuyer1;
  P_05.a[1] = trng::yarn3::LEcuyer1._4_4_;
  trng::yarn3::yarn3((yarn3 *)&lStack_40020,P_05);
  sStack_40160._M_dataplus._M_p = (pointer)&sStack_40160.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_40160,"trng::yarn3","");
  sample_output<trng::yarn3>((yarn3 *)&lStack_40020,&sStack_40160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_40160._M_dataplus._M_p != &sStack_40160.field_2) {
    operator_delete(sStack_40160._M_dataplus._M_p);
  }
  P_06.a[2] = DAT_001cc108;
  P_06.a[0] = (undefined4)trng::yarn3s::trng0;
  P_06.a[1] = trng::yarn3s::trng0._4_4_;
  trng::yarn3s::yarn3s((yarn3s *)&lStack_40020,P_06);
  sStack_40180._M_dataplus._M_p = (pointer)&sStack_40180.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_40180,"trng::yarn3s","");
  sample_output<trng::yarn3s>((yarn3s *)&lStack_40020,&sStack_40180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_40180._M_dataplus._M_p != &sStack_40180.field_2) {
    operator_delete(sStack_40180._M_dataplus._M_p);
  }
  P_02.a[2] = (undefined4)DAT_0022c128;
  P_02.a[3] = DAT_0022c128._4_4_;
  P_02.a[0] = (undefined4)trng::yarn4::LEcuyer1;
  P_02.a[1] = trng::yarn4::LEcuyer1._4_4_;
  trng::yarn4::yarn4((yarn4 *)&lStack_40020,P_02);
  sStack_401a0._M_dataplus._M_p = (pointer)&sStack_401a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_401a0,"trng::yarn4","");
  sample_output<trng::yarn4>((yarn4 *)&lStack_40020,&sStack_401a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_401a0._M_dataplus._M_p != &sStack_401a0.field_2) {
    operator_delete(sStack_401a0._M_dataplus._M_p);
  }
  trng::yarn5::yarn5((yarn5 *)&lStack_40020,(parameter_type *)trng::yarn5::LEcuyer1);
  sStack_401c0._M_dataplus._M_p = (pointer)&sStack_401c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_401c0,"trng::yarn5","");
  sample_output<trng::yarn5>((yarn5 *)&lStack_40020,&sStack_401c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_401c0._M_dataplus._M_p != &sStack_401c0.field_2) {
    operator_delete(sStack_401c0._M_dataplus._M_p);
  }
  trng::yarn5s::yarn5s((yarn5s *)&lStack_40020,(parameter_type *)trng::yarn5s::trng0);
  sStack_401e0._M_dataplus._M_p = (pointer)&sStack_401e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_401e0,"trng::yarn5s","");
  sample_output<trng::yarn5s>((yarn5s *)&lStack_40020,&sStack_401e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_401e0._M_dataplus._M_p != &sStack_401e0.field_2) {
    operator_delete(sStack_401e0._M_dataplus._M_p);
  }
  trng::mt19937::mt19937((mt19937 *)&lStack_40020);
  sStack_40200._M_dataplus._M_p = (pointer)&sStack_40200.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_40200,"trng::mt19937","");
  sample_output<trng::mt19937>((mt19937 *)&lStack_40020,&sStack_40200);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_40200._M_dataplus._M_p != &sStack_40200.field_2) {
    operator_delete(sStack_40200._M_dataplus._M_p);
  }
  trng::mt19937_64::mt19937_64((mt19937_64 *)&lStack_40020);
  sStack_40220._M_dataplus._M_p = (pointer)&sStack_40220.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_40220,"trng::mt19937_64","");
  sample_output<trng::mt19937_64>((mt19937_64 *)&lStack_40020,&sStack_40220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_40220._M_dataplus._M_p != &sStack_40220.field_2) {
    operator_delete(sStack_40220._M_dataplus._M_p);
  }
  memset(&lStack_40020,0,0x40004);
  trng::minstd::minstd(&mStack_402a4,0);
  trng::lagfib2xor<unsigned_long,_9842U,_19937U>::seed<trng::minstd>(&lStack_40020,&mStack_402a4);
  sStack_40240._M_dataplus._M_p = (pointer)&sStack_40240.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&sStack_40240,"trng::lagfib2xor_19937_64","");
  sample_output<trng::lagfib2xor<unsigned_long,9842u,19937u>>(&lStack_40020,&sStack_40240);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_40240._M_dataplus._M_p != &sStack_40240.field_2) {
    operator_delete(sStack_40240._M_dataplus._M_p);
  }
  memset(&lStack_40020,0,0x40004);
  trng::minstd::minstd(&mStack_402a4,0);
  trng::lagfib4xor<unsigned_long,_3860U,_7083U,_11580U,_19937U>::seed<trng::minstd>
            ((lagfib4xor<unsigned_long,_3860U,_7083U,_11580U,_19937U> *)&lStack_40020,&mStack_402a4)
  ;
  sStack_40260._M_dataplus._M_p = (pointer)&sStack_40260.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&sStack_40260,"trng::lagfib4xor_19937_64","");
  sample_output<trng::lagfib4xor<unsigned_long,3860u,7083u,11580u,19937u>>
            ((lagfib4xor<unsigned_long,_3860U,_7083U,_11580U,_19937U> *)&lStack_40020,&sStack_40260)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_40260._M_dataplus._M_p != &sStack_40260.field_2) {
    operator_delete(sStack_40260._M_dataplus._M_p);
  }
  memset(&lStack_40020,0,0x40004);
  trng::minstd::minstd(&mStack_402a4,0);
  trng::lagfib4plus<unsigned_long,_3860U,_7083U,_11580U,_19937U>::seed<trng::minstd>
            ((lagfib4plus<unsigned_long,_3860U,_7083U,_11580U,_19937U> *)&lStack_40020,&mStack_402a4
            );
  sStack_40280._M_dataplus._M_p = (pointer)&sStack_40280.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&sStack_40280,"trng::lagfib2plus_19937_64","");
  sample_output<trng::lagfib4plus<unsigned_long,3860u,7083u,11580u,19937u>>
            ((lagfib4plus<unsigned_long,_3860U,_7083U,_11580U,_19937U> *)&lStack_40020,&sStack_40280
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_40280._M_dataplus._M_p != &sStack_40280.field_2) {
    operator_delete(sStack_40280._M_dataplus._M_p);
  }
  memset(&lStack_40020,0,0x40004);
  trng::minstd::minstd(&mStack_402a4,0);
  trng::lagfib2plus<unsigned_long,_9842U,_19937U>::seed<trng::minstd>
            ((lagfib2plus<unsigned_long,_9842U,_19937U> *)&lStack_40020,&mStack_402a4);
  sStack_402a0._M_dataplus._M_p = (pointer)&sStack_402a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&sStack_402a0,"trng::lagfib4plus_19937_64","");
  sample_output<trng::lagfib2plus<unsigned_long,9842u,19937u>>
            ((lagfib2plus<unsigned_long,_9842U,_19937U> *)&lStack_40020,&sStack_402a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_402a0._M_dataplus._M_p != &sStack_402a0.field_2) {
    operator_delete(sStack_402a0._M_dataplus._M_p);
  }
  return 0;
}

Assistant:

int main() {
  try {
    {
      trng::lcg64 r;
      sample_output(r, "trng::lcg64");
    }
    {
      trng::lcg64_shift r;
      sample_output(r, "trng::lcg64_shift");
    }
    {
      trng::mrg2 r;
      sample_output(r, "trng::mrg2");
    }
    {
      trng::mrg3 r;
      sample_output(r, "trng::mrg3");
    }
    {
      trng::mrg3s r;
      sample_output(r, "trng::mrg3s");
    }
    {
      trng::mrg4 r;
      sample_output(r, "trng::mrg4");
    }
    {
      trng::mrg5 r;
      sample_output(r, "trng::mrg5");
    }
    {
      trng::mrg5s r;
      sample_output(r, "trng::mrg5s");
    }
    {
      trng::yarn2 r;
      sample_output(r, "trng::yarn2");
    }
    {
      trng::yarn3 r;
      sample_output(r, "trng::yarn3");
    }
    {
      trng::yarn3s r;
      sample_output(r, "trng::yarn3s");
    }
    {
      trng::yarn4 r;
      sample_output(r, "trng::yarn4");
    }
    {
      trng::yarn5 r;
      sample_output(r, "trng::yarn5");
    }
    {
      trng::yarn5s r;
      sample_output(r, "trng::yarn5s");
    }
    {
      trng::mt19937 r;
      sample_output(r, "trng::mt19937");
    }
    {
      trng::mt19937_64 r;
      sample_output(r, "trng::mt19937_64");
    }
    {
      trng::lagfib2xor_19937_64 r;
      sample_output(r, "trng::lagfib2xor_19937_64");
    }
    {
      trng::lagfib4xor_19937_64 r;
      sample_output(r, "trng::lagfib4xor_19937_64");
    }
    {
      trng::lagfib4plus_19937_64 r;
      sample_output(r, "trng::lagfib2plus_19937_64");
    }
    {
      trng::lagfib2plus_19937_64 r;
      sample_output(r, "trng::lagfib4plus_19937_64");
    }
  } catch (std::exception &err) {
    std::cerr << err.what() << std::endl;
  } catch (...) {
    std::cerr << "something went wrong" << std::endl;
  }
  return EXIT_SUCCESS;
}